

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-handshake.c
# Opt level: O1

lws * lws_client_reset(lws **pwsi,int ssl,char *address,int port,char *path,char *host,char weak)

{
  undefined1 *puVar1;
  byte bVar2;
  _func_int_lws_ptr_lws_close_status *p_Var3;
  _func_void_lws_ptr *p_Var4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  char *s;
  char *pcVar9;
  lws *plVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *__s;
  char *pcVar14;
  uint local_6c;
  
  if (pwsi != (lws **)0x0) {
    plVar10 = *pwsi;
    _lws_log(0x10,"%s: wsi %p: redir %d: %s\n","lws_client_reset",plVar10,
             (ulong)(uint)(int)plVar10->redirects,address);
    if (plVar10->redirects == '\x03') {
      _lws_log(1,"%s: Too many redirects\n","lws_client_reset");
    }
    else {
      plVar10->redirects = plVar10->redirects + '\x01';
      lVar12 = 0;
      lVar13 = 0;
      do {
        iVar5 = lws_hdr_total_length(plVar10,(uint)"[W\\]^"[lVar12]);
        lVar13 = lVar13 + iVar5 + 1;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 5);
      iVar5 = lws_hdr_total_length(plVar10,_WSI_TOKEN_CLIENT_URI);
      if ((int)lVar13 <= iVar5) {
        iVar5 = lws_hdr_total_length(plVar10,_WSI_TOKEN_CLIENT_URI);
        lVar13 = (long)(iVar5 + 1);
      }
      sVar6 = strlen(path);
      sVar7 = strlen(address);
      sVar8 = strlen(host);
      lVar12 = sVar8 + sVar7 + sVar6 + lVar13;
      s = (char *)lws_realloc((void *)0x0,lVar12 + 4,"lws_client_reset");
      if (s != (char *)0x0) {
        lVar13 = 0;
        pcVar14 = s;
        do {
          bVar2 = "[W\\]^"[lVar13];
          iVar5 = lws_hdr_total_length(plVar10,(uint)bVar2);
          if (iVar5 == 0) {
            *pcVar14 = '\0';
          }
          else {
            pcVar9 = lws_hdr_simple_ptr(plVar10,(uint)bVar2);
            iVar5 = lws_hdr_total_length(plVar10,(uint)bVar2);
            memcpy(pcVar14,pcVar9,(long)(iVar5 + 1));
            iVar5 = lws_hdr_total_length(plVar10,(uint)bVar2);
            pcVar14 = pcVar14 + iVar5;
          }
          pcVar14 = pcVar14 + 1;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 5);
        sVar6 = strlen(address);
        memcpy(pcVar14,address,sVar6 + 1);
        sVar6 = strlen(pcVar14);
        pcVar9 = pcVar14 + sVar6 + 1;
        sVar7 = strlen(host);
        memcpy(pcVar9,host,sVar7 + 1);
        sVar7 = strlen(pcVar9);
        __s = pcVar14 + sVar7 + sVar6 + 2;
        sVar6 = strlen(path);
        memcpy(__s,path,sVar6 + 1);
        uVar11 = (ulong)(uint)port;
        local_6c = ssl;
        if (port == 0) {
          _lws_log(8,"%s: forcing port 443\n","lws_client_reset");
          local_6c = 1;
          uVar11 = 0x1bb;
        }
        _lws_log(8,"redirect ads=\'%s\', port=%d, path=\'%s\', ssl = %d, pifds %d\n",pcVar14,uVar11,
                 __s,(ulong)local_6c,plVar10->position_in_fds_table);
        __remove_wsi_socket_from_fds(plVar10);
        if (weak != '\0') {
          path = (char *)plVar10->ws;
          plVar10->ws = (_lws_websocket_related *)0x0;
        }
        __lws_reset_wsi(plVar10);
        if (weak != '\0') {
          plVar10->ws = (_lws_websocket_related *)path;
        }
        plVar10->field_0x2e2 = plVar10->field_0x2e2 | 0x20;
        lws_ssl_close(plVar10);
        if ((plVar10->role_ops != (lws_role_ops *)0x0) &&
           (p_Var3 = plVar10->role_ops->close_kill_connection,
           p_Var3 != (_func_int_lws_ptr_lws_close_status *)0x0)) {
          (*p_Var3)(plVar10,1);
        }
        p_Var4 = plVar10->context->event_loop_ops->close_handle_manually;
        if (p_Var4 == (_func_void_lws_ptr *)0x0) {
          if ((plVar10->desc).sockfd != -1) {
            close((plVar10->desc).sockfd);
          }
        }
        else {
          (*p_Var4)(plVar10);
        }
        (plVar10->tls).use_ssl = (uint)(local_6c != 0) | (plVar10->tls).use_ssl & 0xfffffffe;
        if (((plVar10->protocol != (lws_protocols *)0x0) &&
            (plVar10->role_ops != (lws_role_ops *)0x0)) && ((plVar10->field_0x2e0 & 4) != 0)) {
          (*plVar10->protocol->callback)
                    (plVar10,(lws_callback_reasons)
                             *(undefined2 *)
                              ((long)plVar10->role_ops->protocol_unbind_cb +
                              (ulong)(plVar10->wsistate >> 0x1c & 2)),plVar10->user_space,
                     "lws_client_reset",0);
          plVar10->field_0x2e0 = plVar10->field_0x2e0 & 0xfb;
        }
        (plVar10->desc).sockfd = -1;
        lws_role_transition(plVar10,0x10000000,LRS_UNCONNECTED,&role_ops_h1);
        if (plVar10->protocol != (lws_protocols *)0x0) {
          lws_bind_protocol(plVar10,plVar10->protocol,"client_reset");
        }
        plVar10->pending_timeout = '\0';
        plVar10->c_port = (uint16_t)uVar11;
        plVar10->field_0x2dc = plVar10->field_0x2dc & 0xfe;
        iVar5 = lws_header_table_attach(plVar10,0);
        if (iVar5 == 0) {
          iVar5 = lws_hdr_simple_create(plVar10,_WSI_TOKEN_CLIENT_PEER_ADDRESS,pcVar14);
          if ((iVar5 == 0) &&
             (iVar5 = lws_hdr_simple_create(plVar10,_WSI_TOKEN_CLIENT_HOST,pcVar9), iVar5 == 0)) {
            lVar13 = 0;
            pcVar14 = s;
            do {
              bVar2 = "[W\\]^"[lVar13];
              iVar5 = lws_hdr_simple_create(plVar10,(uint)bVar2,pcVar14);
              if (iVar5 != 0) goto LAB_001270f7;
              iVar5 = lws_hdr_total_length(plVar10,(uint)bVar2);
              pcVar14 = pcVar14 + (long)iVar5 + 1;
              lVar13 = lVar13 + 1;
            } while (lVar13 != 5);
            *s = '/';
            uVar11 = lVar12 + 3;
            sVar6 = strlen(__s);
            if (sVar6 + 1 <= uVar11) {
              uVar11 = sVar6 + 1;
            }
            memmove(s + 1,__s,uVar11);
            iVar5 = lws_hdr_simple_create(plVar10,_WSI_TOKEN_CLIENT_URI,s);
            if (iVar5 == 0) {
              lws_realloc(s,0,"free");
              if ((plVar10->field_0x2e2 & 0x80) != 0) {
                puVar1 = &(plVar10->h2).field_0x11;
                *puVar1 = *puVar1 & 0xfc;
              }
              plVar10 = lws_client_connect_2_dnsreq(plVar10);
              *pwsi = plVar10;
              return plVar10;
            }
          }
        }
        else {
          _lws_log(1,"%s: failed to get ah\n","lws_client_reset");
        }
LAB_001270f7:
        lws_realloc(s,0,"free");
      }
    }
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_client_reset(struct lws **pwsi, int ssl, const char *address, int port,
		 const char *path, const char *host, char weak)
{
#if defined(LWS_ROLE_WS)
	struct _lws_websocket_related *ws;
#endif
	char *stash, *p;
	struct lws *wsi;
	size_t size = 0;
	int n;

	if (!pwsi)
		return NULL;

	wsi = *pwsi;

	lwsl_debug("%s: wsi %p: redir %d: %s\n", __func__, wsi, wsi->redirects,
			address);

	if (wsi->redirects == 3) {
		lwsl_err("%s: Too many redirects\n", __func__);
		return NULL;
	}
	wsi->redirects++;

	/*
	 * goal is to close our role part, close the sockfd, detach the ah
	 * but leave our wsi extant and still bound to whatever vhost it was
	 */

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		size += lws_hdr_total_length(wsi, hnames2[n]) + 1;

	if ((int)size < lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI) + 1)
		size = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI) + 1;

	/*
	 * The incoming address and host can be from inside the existing ah
	 * we are going to detach and reattch
	 */

	size += strlen(path) + 1 + strlen(address) + 1 + strlen(host) + 1 + 1;

	p = stash = lws_malloc(size, __func__);
	if (!stash)
		return NULL;

	/*
	 * _WSI_TOKEN_CLIENT_ORIGIN,
	 * _WSI_TOKEN_CLIENT_SENT_PROTOCOLS,
	 * _WSI_TOKEN_CLIENT_METHOD,
	 * _WSI_TOKEN_CLIENT_IFACE,
	 * _WSI_TOKEN_CLIENT_ALPN
	 * address
	 * host
	 * path
	 */

	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++)
		if (lws_hdr_total_length(wsi, hnames2[n])) {
			memcpy(p, lws_hdr_simple_ptr(wsi, hnames2[n]),
				lws_hdr_total_length(wsi, hnames2[n]) + 1);
			p += lws_hdr_total_length(wsi, hnames2[n]) + 1;
		} else
			*p++ = '\0';

	memcpy(p, address, strlen(address) + 1);
	address = p;
	p += strlen(address) + 1;
	memcpy(p, host, strlen(host) + 1);
	host = p;
	p += strlen(host) + 1;
	memcpy(p, path, strlen(path) + 1);
	path = p;

	if (!port) {
		lwsl_info("%s: forcing port 443\n", __func__);

		port = 443;
		ssl = 1;
	}

	lwsl_info("redirect ads='%s', port=%d, path='%s', ssl = %d, pifds %d\n",
		   address, port, path, ssl, wsi->position_in_fds_table);

	__remove_wsi_socket_from_fds(wsi);
#if defined(LWS_ROLE_WS)
	if (weak) {
		ws = wsi->ws;
		wsi->ws = NULL;
	}
#endif
	__lws_reset_wsi(wsi); /* detaches ah here */
#if defined(LWS_ROLE_WS)
	if (weak)
		wsi->ws = ws;
#endif
	wsi->client_pipeline = 1;

	/* close the connection by hand */

#if defined(LWS_WITH_TLS)
	lws_ssl_close(wsi);
#endif

	if (wsi->role_ops && wsi->role_ops->close_kill_connection)
		wsi->role_ops->close_kill_connection(wsi, 1);

	if (wsi->context->event_loop_ops->close_handle_manually)
		wsi->context->event_loop_ops->close_handle_manually(wsi);
	else
		if (wsi->desc.sockfd != LWS_SOCK_INVALID)
			compatible_close(wsi->desc.sockfd);

#if defined(LWS_WITH_TLS)
	if (!ssl)
		wsi->tls.use_ssl &= ~LCCSCF_USE_SSL;
	else
		wsi->tls.use_ssl |= LCCSCF_USE_SSL;
#else
	if (ssl) {
		lwsl_err("%s: not configured for ssl\n", __func__);
		goto bail;
	}
#endif

	if (wsi->protocol && wsi->role_ops && wsi->protocol_bind_balance) {
		wsi->protocol->callback(wsi,
				wsi->role_ops->protocol_unbind_cb[
				       !!lwsi_role_server(wsi)],
				       wsi->user_space, (void *)__func__, 0);

		wsi->protocol_bind_balance = 0;
	}

	wsi->desc.sockfd = LWS_SOCK_INVALID;
	lws_role_transition(wsi, LWSIFR_CLIENT, LRS_UNCONNECTED, &role_ops_h1);
//	wsi->protocol = NULL;
	if (wsi->protocol)
		lws_bind_protocol(wsi, wsi->protocol, "client_reset");
	wsi->pending_timeout = NO_PENDING_TIMEOUT;
	wsi->c_port = port;
	wsi->hdr_parsing_completed = 0;

	if (lws_header_table_attach(wsi, 0)) {
		lwsl_err("%s: failed to get ah\n", __func__);
		goto bail;
	}
	//_lws_header_table_reset(wsi->http.ah);

	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_PEER_ADDRESS, address))
		goto bail;

	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_HOST, host))
		goto bail;

	/*
	 * _WSI_TOKEN_CLIENT_ORIGIN,
	 * _WSI_TOKEN_CLIENT_SENT_PROTOCOLS,
	 * _WSI_TOKEN_CLIENT_METHOD,
	 * _WSI_TOKEN_CLIENT_IFACE,
	 * _WSI_TOKEN_CLIENT_ALPN
	 * address
	 * host
	 * path
	 */

	p = stash;
	for (n = 0; n < (int)LWS_ARRAY_SIZE(hnames2); n++) {
		if (lws_hdr_simple_create(wsi, hnames2[n], p))
			goto bail;
		p += lws_hdr_total_length(wsi, hnames2[n]) + 1;
	}

	stash[0] = '/';
	memmove(&stash[1], path, size - 1 < strlen(path) + 1 ? size - 1 : strlen(path) + 1);
	if (lws_hdr_simple_create(wsi, _WSI_TOKEN_CLIENT_URI, stash))
		goto bail;

	lws_free_set_NULL(stash);

#if defined(LWS_WITH_HTTP2)
	if (wsi->client_mux_substream)
		wsi->h2.END_STREAM = wsi->h2.END_HEADERS = 0;
#endif

	*pwsi = lws_client_connect_2_dnsreq(wsi);

	return *pwsi;

bail:
	lws_free_set_NULL(stash);

	return NULL;
}